

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerUnaryHelperMemWithTemp2
          (Lowerer *this,Instr *instr,JnHelperMethod helperMethod,
          JnHelperMethod helperMethodWithTemp)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Lowerer *pLVar4;
  Instr *instrFirst;
  JnHelperMethod local_28;
  JnHelperMethod local_24;
  JnHelperMethod helperMethodWithTemp_local;
  JnHelperMethod helperMethod_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  local_28 = helperMethodWithTemp;
  local_24 = helperMethod;
  _helperMethodWithTemp_local = instr;
  instr_local = (Instr *)this;
  instrFirst._4_4_ = Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode);
  bVar2 = Js::OpLayoutType::operator==((OpLayoutType *)((long)&instrFirst + 4),Reg2);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2213,
                       "(Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg2)"
                       ,"Expected a unary instruction...");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((*(ushort *)&_helperMethodWithTemp_local->field_0x36 >> 1 & 1) == 0) {
    this_local = (Lowerer *)
                 LowerUnaryHelperMem(this,_helperMethodWithTemp_local,local_24,(Opnd *)0x0);
  }
  else {
    pLVar4 = (Lowerer *)LoadHelperTemp(this,_helperMethodWithTemp_local,_helperMethodWithTemp_local)
    ;
    LowerUnaryHelperMem(this,_helperMethodWithTemp_local,local_28,(Opnd *)0x0);
    this_local = pLVar4;
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
Lowerer::LowerUnaryHelperMemWithTemp2(IR::Instr *instr, IR::JnHelperMethod helperMethod, IR::JnHelperMethod helperMethodWithTemp)
{
    AssertMsg(Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg2, "Expected a unary instruction...");

    if (instr->dstIsTempNumber)
    {
        IR::Instr * instrFirst = this->LoadHelperTemp(instr, instr);
        this->LowerUnaryHelperMem(instr, helperMethodWithTemp);
        return instrFirst;
    }

    return this->LowerUnaryHelperMem(instr, helperMethod);
}